

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack16.h
# Opt level: O0

void ncnn::conv1x1s2_sgemm_pack16_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  long in_RSI;
  long *in_RDI;
  __m512 _v;
  int j;
  int i;
  float *outptr;
  float *r0;
  int p;
  Mat bottom_blob_shrinked;
  int tailstep;
  int outh;
  int outw;
  int elempack;
  size_t elemsize;
  int channels;
  int w;
  Mat *m_1;
  Mat *m;
  int in_stack_fffffffffffffb5c;
  size_t in_stack_fffffffffffffb60;
  void **ppvVar1;
  undefined8 in_stack_fffffffffffffb68;
  undefined8 in_stack_fffffffffffffb70;
  Mat *in_stack_fffffffffffffb78;
  Option *in_stack_fffffffffffffbc8;
  Mat *in_stack_fffffffffffffbd0;
  Mat *in_stack_fffffffffffffbd8;
  Mat *in_stack_fffffffffffffbe0;
  Mat *in_stack_fffffffffffffbe8;
  int local_3d8;
  int local_3d4;
  undefined8 local_3d0;
  undefined8 local_3c8;
  undefined8 local_3c0;
  undefined4 local_3b8;
  long *local_3b0;
  undefined4 local_3a8;
  undefined4 local_3a4;
  undefined4 local_3a0;
  undefined4 local_39c;
  undefined4 local_398;
  undefined8 local_390;
  undefined8 *local_388;
  undefined8 local_380;
  undefined8 local_378;
  undefined8 local_370;
  undefined4 local_368;
  long local_360;
  undefined4 local_358;
  undefined4 local_354;
  undefined4 local_350;
  undefined4 local_34c;
  undefined4 local_348;
  undefined8 local_340;
  undefined8 *local_338;
  int local_330;
  void *local_320;
  int *local_318;
  long local_310;
  undefined4 local_308;
  long *local_300;
  undefined4 local_2f8;
  int local_2f4;
  int local_2f0;
  undefined4 local_2ec;
  undefined4 local_2e8;
  long local_2e0;
  int local_2d8;
  int local_2d4;
  int local_2d0;
  undefined4 local_2cc;
  long local_2c8;
  int local_2c0;
  int local_2bc;
  long *local_298;
  void **local_290;
  undefined8 *local_288;
  undefined8 *local_278;
  void **local_268;
  int local_248;
  undefined4 local_244;
  void **local_240;
  undefined8 *local_220;
  undefined8 *local_200;
  undefined1 local_1f5;
  int local_1f4;
  void **local_1f0;
  undefined8 *local_1e8;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  undefined1 local_1b5;
  int local_1b4;
  undefined8 *local_1a8;
  void *local_158;
  undefined8 *local_148;
  undefined8 local_140;
  Option *pOStack_138;
  Mat *pMStack_130;
  Mat *pMStack_128;
  Mat *pMStack_120;
  Mat *pMStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 *local_e8;
  long local_e0;
  undefined4 local_d4;
  long local_d0;
  undefined8 *local_c8;
  undefined4 local_bc;
  int local_b8;
  int local_b4;
  undefined8 *local_b0;
  long *local_a8;
  undefined4 local_9c;
  long local_98;
  undefined8 *local_90;
  undefined4 local_84;
  int local_80;
  int local_7c;
  undefined8 *local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  
  local_2bc = *(int *)((long)in_RDI + 0x2c);
  local_2c0 = (int)in_RDI[7];
  local_2c8 = in_RDI[2];
  local_2cc = (undefined4)in_RDI[3];
  local_2d0 = *(int *)(in_RSI + 0x2c);
  local_2d4 = *(int *)(in_RSI + 0x30);
  local_2d8 = (local_2bc * 2 + local_2d0 * -2) * 0x10;
  local_290 = &local_320;
  local_320 = (void *)0x0;
  local_318 = (int *)0x0;
  local_310 = 0;
  local_308 = 0;
  local_300 = (long *)0x0;
  local_2f8 = 0;
  local_2f4 = 0;
  local_2f0 = 0;
  local_2ec = 0;
  local_2e8 = 0;
  local_2e0 = 0;
  local_298 = in_RDI;
  Mat::create(in_stack_fffffffffffffb78,(int)((ulong)in_stack_fffffffffffffb70 >> 0x20),
              (int)in_stack_fffffffffffffb70,(int)((ulong)in_stack_fffffffffffffb68 >> 0x20),
              in_stack_fffffffffffffb60,in_stack_fffffffffffffb5c,
              (Allocator *)in_stack_fffffffffffffbd8);
  for (local_330 = 0; local_330 < local_2c0; local_330 = local_330 + 1) {
    local_1a8 = &local_380;
    local_b4 = *(int *)((long)local_298 + 0x2c);
    local_b8 = (int)local_298[6];
    local_bc = *(undefined4 *)((long)local_298 + 0x34);
    local_c8 = (undefined8 *)(*local_298 + local_298[8] * (long)local_330 * local_298[2]);
    local_d0 = local_298[2];
    local_d4 = (undefined4)local_298[3];
    local_e0 = local_298[4];
    local_b0 = &local_380;
    local_58 = (long)local_b4 * (long)local_b8 * local_d0;
    local_1c0 = &local_380;
    local_288 = &local_380;
    local_1e8 = &local_3d0;
    local_1f0 = &local_320;
    local_90 = (undefined8 *)((long)local_320 + local_2e0 * local_330 * local_310);
    local_78 = &local_3d0;
    local_68 = (long)local_2f4 * (long)local_2f0 * local_310;
    local_1c8 = &local_3d0;
    local_278 = &local_3d0;
    local_348 = 0;
    local_34c = 0;
    local_350 = 0;
    local_354 = 0;
    local_368 = 0;
    local_370 = 0;
    local_378 = 0;
    local_380 = 0;
    local_3b0 = local_300;
    local_5c = 0x10;
    local_6c = 0x10;
    local_7c = local_2f4;
    local_80 = local_2f0;
    local_84 = local_2ec;
    local_98 = local_310;
    local_9c = local_308;
    local_a8 = local_300;
    local_1b4 = local_330;
    local_1b5 = 1;
    local_1f4 = local_330;
    local_1f5 = 1;
    local_340 = 0;
    local_358 = 0;
    local_3d0 = 0;
    local_3c0 = 0;
    local_3b8 = 0;
    local_3a8 = 0;
    local_3a4 = 0;
    local_3a0 = 0;
    local_39c = 0;
    local_398 = 0;
    local_390 = 0;
    local_3c8 = 0;
    local_388 = local_90;
    local_338 = local_c8;
    for (local_3d4 = 0; local_3d4 < local_2d4; local_3d4 = local_3d4 + 1) {
      for (local_3d8 = 0; local_3d8 < local_2d0; local_3d8 = local_3d8 + 1) {
        local_148 = local_338;
        local_140 = *local_338;
        in_stack_fffffffffffffbc8 = (Option *)local_338[1];
        in_stack_fffffffffffffbd0 = (Mat *)local_338[2];
        in_stack_fffffffffffffbd8 = (Mat *)local_338[3];
        in_stack_fffffffffffffbe0 = (Mat *)local_338[4];
        in_stack_fffffffffffffbe8 = (Mat *)local_338[5];
        uStack_110 = local_338[6];
        uStack_108 = local_338[7];
        local_e8 = local_388;
        *local_388 = local_140;
        local_388[1] = in_stack_fffffffffffffbc8;
        local_388[2] = in_stack_fffffffffffffbd0;
        local_388[3] = in_stack_fffffffffffffbd8;
        local_388[4] = in_stack_fffffffffffffbe0;
        local_388[5] = in_stack_fffffffffffffbe8;
        local_388[6] = uStack_110;
        local_388[7] = uStack_108;
        local_338 = local_338 + 0x10;
        local_388 = local_388 + 8;
        pOStack_138 = in_stack_fffffffffffffbc8;
        pMStack_130 = in_stack_fffffffffffffbd0;
        pMStack_128 = in_stack_fffffffffffffbd8;
        pMStack_120 = in_stack_fffffffffffffbe0;
        pMStack_118 = in_stack_fffffffffffffbe8;
      }
      local_338 = (undefined8 *)((long)local_338 + (long)local_2d8 * 4);
    }
    local_220 = local_278;
    local_200 = local_288;
    local_360 = local_e0;
  }
  conv1x1s1_sgemm_pack16_avx512
            (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,
             in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  ppvVar1 = &local_320;
  if (local_318 != (int *)0x0) {
    local_244 = 0xffffffff;
    LOCK();
    local_248 = *local_318;
    *local_318 = *local_318 + -1;
    UNLOCK();
    if (local_248 == 1) {
      local_268 = ppvVar1;
      local_240 = ppvVar1;
      if (local_300 == (long *)0x0) {
        local_158 = local_320;
        if (local_320 != (void *)0x0) {
          free(local_320);
        }
      }
      else {
        (**(code **)(*local_300 + 0x18))(local_300,local_320);
      }
    }
  }
  *ppvVar1 = (void *)0x0;
  ppvVar1[2] = (void *)0x0;
  *(undefined4 *)(ppvVar1 + 3) = 0;
  *(undefined4 *)(ppvVar1 + 5) = 0;
  *(undefined4 *)((long)ppvVar1 + 0x2c) = 0;
  *(undefined4 *)(ppvVar1 + 6) = 0;
  *(undefined4 *)((long)ppvVar1 + 0x34) = 0;
  *(undefined4 *)(ppvVar1 + 7) = 0;
  ppvVar1[8] = (void *)0x0;
  ppvVar1[1] = (void *)0x0;
  return;
}

Assistant:

static void conv1x1s2_sgemm_pack16_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = (w - 2 * outw + w) * 16;

    Mat bottom_blob_shrinked;
    bottom_blob_shrinked.create(outw, outh, channels, elemsize, elempack, opt.workspace_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < channels; p++)
    {
        const float* r0 = bottom_blob.channel(p);
        float* outptr = bottom_blob_shrinked.channel(p);

        for (int i = 0; i < outh; i++)
        {
            int j = 0;
            for (; j < outw; j++)
            {
                __m512 _v = _mm512_loadu_ps(r0);
                _mm512_storeu_ps(outptr, _v);

                r0 += 32;
                outptr += 16;
            }

            r0 += tailstep;
        }
    }

    conv1x1s1_sgemm_pack16_avx512(bottom_blob_shrinked, top_blob, kernel, _bias, opt);
}